

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_list.cpp
# Opt level: O2

void __thiscall Am_Priority_List::Make_Empty(Am_Priority_List *this)

{
  Am_Priority_List_Item *pAVar1;
  Am_Priority_List_Item *this_00;
  
  this_00 = this->head;
  while (this_00 != (Am_Priority_List_Item *)0x0) {
    pAVar1 = this_00->next;
    Am_Object::~Am_Object(&this_00->obj);
    operator_delete(this_00);
    this_00 = pAVar1;
  }
  this->current = (Am_Priority_List_Item *)0x0;
  this->head = (Am_Priority_List_Item *)0x0;
  this->tail = (Am_Priority_List_Item *)0x0;
  return;
}

Assistant:

void
Am_Priority_List::Make_Empty()
{
  Am_Priority_List_Item *item;
  Am_Priority_List_Item *p = head;
  while (p) {
    item = p;
    p = p->next;
    delete item;
  }
  head = nullptr;
  tail = nullptr;
  current = nullptr;
}